

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O1

void cave_illuminate(chunk *c,_Bool daytime)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  loc lVar6;
  loc lVar7;
  square *psVar8;
  wchar_t wVar9;
  long lVar10;
  bool bVar11;
  
  if (L'\0' < c->height) {
    wVar5 = L'\0';
    do {
      if (L'\0' < c->width) {
        wVar9 = L'\0';
        do {
          lVar6 = (loc)loc(wVar9,wVar5);
          lVar10 = 0;
          bVar11 = false;
          do {
            lVar7 = (loc)loc_sum((loc_conflict)lVar6,(loc_conflict)ddgrid_ddd[lVar10]);
            _Var4 = square_in_bounds_fully((chunk_conflict *)c,lVar7);
            if (_Var4) {
              _Var4 = square_isfloor((chunk_conflict *)c,lVar7);
              if (!_Var4) {
                _Var4 = square_isstairs((chunk_conflict *)c,lVar7);
                if (!_Var4) goto LAB_00127850;
              }
              bVar11 = true;
            }
LAB_00127850:
            lVar10 = lVar10 + 1;
          } while (lVar10 != 9);
          if (daytime) {
LAB_001278b8:
            psVar8 = square((chunk_conflict *)c,lVar6);
            flag_on_dbg(psVar8->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
            if (bVar11) {
              square_memorize((chunk_conflict *)c,lVar6);
            }
          }
          else {
            _Var4 = square_isfloor((chunk_conflict *)c,lVar6);
            if (!_Var4) goto LAB_001278b8;
            _Var4 = square_isbright((chunk_conflict *)c,lVar6);
            if (!_Var4) {
              psVar8 = square((chunk_conflict *)c,lVar6);
              flag_off(psVar8->info,3,2);
              _Var4 = square_isfloor((chunk_conflict *)c,lVar6);
              if (_Var4) {
                square_forget((chunk_conflict *)c,lVar6);
              }
            }
          }
          wVar9 = wVar9 + L'\x01';
        } while (wVar9 < c->width);
      }
      wVar5 = wVar5 + L'\x01';
    } while (wVar5 < c->height);
  }
  if (L'\0' < c->height) {
    wVar5 = L'\0';
    do {
      if (L'\0' < c->width) {
        wVar9 = L'\0';
        do {
          lVar6 = (loc)loc(wVar9,wVar5);
          _Var4 = square_isshop((chunk_conflict *)c,lVar6);
          if (_Var4) {
            lVar10 = 0;
            do {
              lVar7 = (loc)loc_sum((loc_conflict)lVar6,(loc_conflict)ddgrid_ddd[lVar10]);
              psVar8 = square((chunk_conflict *)c,lVar7);
              flag_on_dbg(psVar8->info,3,2,"square(c, a_grid)->info","SQUARE_GLOW");
              square_memorize((chunk_conflict *)c,lVar7);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 8);
          }
          wVar9 = wVar9 + L'\x01';
        } while (wVar9 < c->width);
      }
      wVar5 = wVar5 + L'\x01';
    } while (wVar5 < c->height);
  }
  ppVar3 = player->upkeep;
  puVar1 = &ppVar3->update;
  *puVar1 = *puVar1 | 0x60;
  pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
  *pbVar2 = *pbVar2 | 0xc1;
  return;
}

Assistant:

void cave_illuminate(struct chunk *c, bool daytime)
{
	int y, x, i;

	/* Apply light or darkness */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			int d;
			bool light = false;
			struct loc grid = loc(x, y);
			
			/* Skip grids with no surrounding floors or stairs */
			for (d = 0; d < 9; d++) {
				/* Extract adjacent (legal) location */
				struct loc a_grid = loc_sum(grid, ddgrid_ddd[d]);

				/* Paranoia */
				if (!square_in_bounds_fully(c, a_grid)) continue;

				/* Test */
				if (square_isfloor(c, a_grid) || square_isstairs(c, a_grid))
					light = true;
			}

			/* Only interesting grids at night */
			if (daytime || !square_isfloor(c, grid)) {
				sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
				if(light) square_memorize(c, grid);
			} else if (!square_isbright(c, grid)) {
				sqinfo_off(square(c, grid)->info, SQUARE_GLOW);
				/* Hack -- like cave_unlight(), forget "boring" grids */
				if (square_isfloor(c, grid))
					square_forget(c, grid);
			}
		}
	}
			
			
	/* Light shop doorways */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			if (!square_isshop(c, grid))
				continue;
			for (i = 0; i < 8; i++) {
				struct loc a_grid = loc_sum(grid, ddgrid_ddd[i]);
				sqinfo_on(square(c, a_grid)->info, SQUARE_GLOW);
				square_memorize(c, a_grid);
			}
		}
	}


	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw map, monster list */
	player->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);
}